

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O0

void __thiscall
despot::TabularCPT::TabularCPT
          (TabularCPT *this,NamedVar *child,
          vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *parents)

{
  size_type sVar1;
  reference ppNVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  reference this_00;
  int local_38;
  int local_34;
  int i_1;
  int i;
  int parent_size;
  vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *parents_local;
  NamedVar *child_local;
  TabularCPT *this_local;
  
  CPT::CPT(&this->super_CPT);
  (this->super_CPT).super_Function._vptr_Function = (_func_int **)&PTR__TabularCPT_0026e798;
  std::
  vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
  ::vector(&this->sparse_values_);
  (this->super_CPT).super_Function.child_ = child;
  std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::operator=
            (&(this->super_CPT).super_Function.parents_,parents);
  i_1 = 1;
  for (local_34 = 0;
      sVar1 = std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::size(parents),
      (ulong)(long)local_34 < sVar1; local_34 = local_34 + 1) {
    ppNVar2 = std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::operator[]
                        (parents,(long)local_34);
    pvVar3 = Variable::values_abi_cxx11_(&(*ppNVar2)->super_Variable);
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(pvVar3);
    i_1 = i_1 * (int)sVar1;
  }
  pvVar3 = Variable::values_abi_cxx11_(&child->super_Variable);
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(pvVar3);
  if (sVar1 < 100) {
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(&(this->super_CPT).super_Function.values_,(long)i_1);
    for (local_38 = 0; local_38 < i_1; local_38 = local_38 + 1) {
      this_00 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[](&(this->super_CPT).super_Function.values_,(long)local_38);
      pvVar3 = Variable::values_abi_cxx11_(&child->super_Variable);
      sVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(pvVar3);
      std::vector<double,_std::allocator<double>_>::resize(this_00,sVar1);
    }
  }
  else {
    std::
    vector<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::allocator<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>
    ::resize(&(this->super_CPT).super_Function.map_,(long)i_1);
  }
  return;
}

Assistant:

TabularCPT::TabularCPT(NamedVar* child, vector<NamedVar*> parents) {
	child_ = child;
	parents_ = parents;

	int parent_size = 1;
	for (int i = 0; i < parents.size(); i++)
		parent_size *= parents[i]->values().size();

	if (child->values().size() < 100) { // TODO: possible refactoring to use a single data structure
		values_.resize(parent_size);
		for (int i = 0; i < parent_size; i++)
			values_[i].resize(child->values().size());
	} else {
		map_.resize(parent_size);
	}
}